

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_benchmark.cpp
# Opt level: O2

int main(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int value;
  ostream *poVar1;
  istream *piVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_72a;
  allocator<char> local_729;
  allocator<char> local_728;
  allocator<char> local_727;
  allocator<char> local_726;
  allocator<char> local_725;
  int local_724;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_720;
  AVLTree<int> avlTree;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> output_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  fstream output_file;
  ostream local_638 [16];
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  string local_568 [32];
  string local_548 [32];
  string local_528 [240];
  ifstream input_file;
  byte abStack_418 [488];
  ofstream output_file1;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&path,&kDatasetPath,(allocator<char> *)&output_file);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&output_file,&kProjectPath,(allocator<char> *)&input_file);
  std::operator+(&output_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output_file,
                 "/benchmark/result/insertResults.csv");
  std::__cxx11::string::~string((string *)&output_file);
  std::ofstream::ofstream(&output_file1,(string *)&output_path,_S_out);
  std::ofstream::close();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output_file,"100",(allocator<char> *)&input_file);
  std::__cxx11::string::string<std::allocator<char>>(local_628,"500",(allocator<char> *)&line);
  std::__cxx11::string::string<std::allocator<char>>(local_608,"1000",(allocator<char> *)&local_6e0)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_5e8,"5000",(allocator<char> *)&local_668)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_5c8,"10000",(allocator<char> *)&avlTree);
  std::__cxx11::string::string<std::allocator<char>>(local_5a8,"50000",&local_725);
  std::__cxx11::string::string<std::allocator<char>>(local_588,"100000",&local_726);
  std::__cxx11::string::string<std::allocator<char>>(local_568,"500000",&local_727);
  std::__cxx11::string::string<std::allocator<char>>(local_548,"1000000",&local_728);
  std::__cxx11::string::string<std::allocator<char>>(local_528,"5000000",&local_729);
  __l._M_len = 10;
  __l._M_array = (iterator)&output_file;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&files,__l,&local_72a);
  lVar3 = 0x120;
  do {
    std::__cxx11::string::~string((string *)(&output_file + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  itis::AVLTree<int>::AVLTree(&avlTree);
  while (files.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         files.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    local_720 = files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    for (local_724 = 1; __rhs = local_720, local_724 != 0xb; local_724 = local_724 + 1) {
      std::operator+(&local_6e0,&path,"/");
      std::operator+(&line,&local_6e0,__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &output_file,&line,".csv");
      std::ifstream::ifstream((istream *)&input_file,(string *)&output_file,_S_in);
      std::__cxx11::string::~string((string *)&output_file);
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::operator+(&line,&path,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &output_file,&line,__rhs);
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)&output_file);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string((string *)&output_file);
      std::__cxx11::string::~string((string *)&line);
      std::operator+(&local_668,&path,"/");
      std::operator+(&local_6e0,&local_668,__rhs);
      std::operator+(&line,&local_6e0,".csv");
      std::ifstream::ifstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output_file,
                 (string *)&line,_S_in);
      std::ifstream::operator=((istream *)&input_file,(ifstream *)&output_file);
      std::ifstream::~ifstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output_file);
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::__cxx11::string::~string((string *)&local_668);
      if ((abStack_418[*(long *)(_input_file + -0x18)] & 5) == 0) {
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_local_buf[0] = '\0';
        while (piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)&input_file,(string *)&line,','),
              ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)&output_file,(string *)&line,_S_out|_S_in);
          std::chrono::_V2::system_clock::now();
          value = std::__cxx11::stoi(&line,(size_t *)0x0,10);
          itis::AVLTree<int>::insert(&avlTree,value);
          std::chrono::_V2::system_clock::now();
          std::__cxx11::stringstream::~stringstream((stringstream *)&output_file);
        }
        std::__cxx11::string::~string((string *)&line);
      }
      poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
      std::endl<char,std::char_traits<char>>(poVar1);
      itis::AVLTree<int>::clear(&avlTree);
      std::ifstream::close();
      std::fstream::fstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output_file,
                 (string *)&output_path,_S_app);
      poVar1 = std::operator<<(local_638,(string *)local_720);
      poVar1 = std::operator<<(poVar1,",");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_724);
      poVar1 = std::operator<<(poVar1,",");
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::fstream::close();
      std::fstream::~fstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output_file);
      std::ifstream::~ifstream((istream *)&input_file);
    }
    local_724 = 0xb;
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_720 + 1;
  }
  itis::AVLTree<int>::~AVLTree(&avlTree);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  std::ofstream::~ofstream(&output_file1);
  std::__cxx11::string::~string((string *)&output_path);
  std::__cxx11::string::~string((string *)&path);
  return 0;
}

Assistant:

int main() {

  // Tip 1: входные аргументы позволяют более гибко контролировать параметры вашей программы
  const auto path = string(kDatasetPath);
  const auto output_path = string(kProjectPath) + "/benchmark/result/insertResults.csv";

  auto output_file1 = ofstream(output_path);
  output_file1.close();
  // работа с набором данных
  vector<string> files = {"100", "500", "1000", "5000", "10000", "50000", "100000", "500000", "1000000", "5000000"};
  AVLTree<int> avlTree;

  for (const string& file : files) {  // Проходим по всем 10 .csv файлам
    for (int i = 1; i < 11; i++) {    // Запускаем замерку времени 10 раз
      auto input_file = ifstream(path + "/" + file + ".csv");
      auto time_diff_insert = chrono::nanoseconds::zero();
      cout << (path + "/" + file) << endl;

      input_file = ifstream(path + "/" + file + ".csv");

      //         здесь находится участок кода, время которого необходимо замерить
      if (input_file) {
        int line_number = 0;
        for (string line; getline(input_file, line, ','); /* ... */) {
          auto ss = stringstream(line);
          const auto time_point_before_insert = chrono::high_resolution_clock::now();
          avlTree.insert(stoi(line));
          const auto time_point_after_insert = chrono::high_resolution_clock::now();
          line_number++;
          time_diff_insert += time_point_after_insert - time_point_before_insert;
        }
      }

      const auto time_elapsed_ns_insert = chrono::duration_cast<chrono::nanoseconds>(time_diff_insert).count();
      cout << time_elapsed_ns_insert << endl;

      avlTree.clear();
      input_file.close();

      //Открываем файл для записи и вносим полученые данные
      auto output_file = fstream(output_path, ios::app);
      output_file << file << "," << i << "," << time_elapsed_ns_insert << endl;
      output_file.close();
    }
  }
  return 0;
}